

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O2

void tidyBufAppend(TidyBuffer *buf,void *vp,uint size)

{
  if (buf != (TidyBuffer *)0x0) {
    if (size != 0 && vp != (void *)0x0) {
      tidyBufCheckAlloc(buf,buf->size + size,0);
      memcpy(buf->bp + buf->size,vp,(ulong)size);
      buf->size = buf->size + size;
    }
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/buffio.c",
                0xa7,"void tidyBufAppend(TidyBuffer *, void *, uint)");
}

Assistant:

void TIDY_CALL tidyBufAppend( TidyBuffer* buf, void* vp, uint size )
{
    assert( buf != NULL );
    if ( vp != NULL && size > 0 )
    {
        tidyBufCheckAlloc( buf, buf->size + size, 0 );
        memcpy( buf->bp + buf->size, vp, size );
        buf->size += size;
    }
}